

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O1

reference __thiscall
QVLABase<char_const*>::emplace_back_impl<char_const*const&>
          (QVLABase<char_const*> *this,qsizetype prealloc,void *array,char **args)

{
  reference ppcVar1;
  long lVar2;
  long aalloc;
  
  lVar2 = *(long *)(this + 8);
  if (lVar2 == *(long *)this) {
    aalloc = lVar2 + 1;
    if (lVar2 + 1 < lVar2 * 2) {
      aalloc = lVar2 * 2;
    }
    QVLABase<const_char_*>::reallocate_impl
              ((QVLABase<const_char_*> *)this,prealloc,array,lVar2,aalloc);
  }
  lVar2 = *(long *)(this + 8);
  ppcVar1 = (reference)(*(long *)(this + 0x10) + lVar2 * 8);
  *ppcVar1 = *args;
  *(long *)(this + 8) = lVar2 + 1;
  return ppcVar1;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }